

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
          (TPZMultiphysicsCompMesh *this,TPZVec<TPZCompMesh_*> *mesh_vector,TPZVec<long> *gelindexes
          )

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  TPZCompMesh *in_RDI;
  int n_approx_spaces;
  int64_t i;
  TPZMultiphysicsCompMesh *in_stack_00000110;
  TPZMultiphysicsCompMesh *in_stack_00000250;
  TPZVec<long> *in_stack_ffffffffffffff48;
  TPZManVector<TPZCompMesh_*,_7> *in_stack_ffffffffffffff50;
  TPZManVector<TPZCompMesh_*,_7> *rval;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int64_t in_stack_ffffffffffffff78;
  TPZMultiphysicsCompMesh *this_00;
  TPZMultiphysicsCompMesh *index;
  TPZManVector<int,_5> *in_stack_ffffffffffffff80;
  TPZVec<TPZCompMesh_*> *in_stack_ffffffffffffff88;
  TPZManVector<TPZCompMesh_*,_7> *in_stack_ffffffffffffff90;
  
  rval = (TPZManVector<TPZCompMesh_*,_7> *)&stack0xffffffffffffff90;
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  TPZManVector<TPZCompMesh_*,_7>::operator=
            ((TPZManVector<TPZCompMesh_*,_7> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),rval);
  TPZManVector<TPZCompMesh_*,_7>::~TPZManVector(in_stack_ffffffffffffff50);
  TPZVec<TPZCompMesh_*>::size((TPZVec<TPZCompMesh_*> *)((long)&in_RDI[1].fName.field_2 + 8));
  TPZManVector<int,_5>::Resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (TPZMultiphysicsCompMesh *)0x0;
  while( true ) {
    index = this_00;
    iVar2 = TPZVec<int>::size((TPZVec<int> *)(in_RDI + 1));
    if (iVar2 <= (long)this_00) break;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 1),(int64_t)index);
    *piVar3 = 1;
    this_00 = (TPZMultiphysicsCompMesh *)&(index->super_TPZCompMesh).field_0x1;
  }
  iVar2 = TPZVec<TPZCompMesh_*>::size((TPZVec<TPZCompMesh_*> *)((long)&in_RDI[1].fName.field_2 + 8))
  ;
  iVar1 = (int)iVar2;
  TPZCompMesh::SetNMeshes(in_RDI,(long)iVar1);
  TPZCompMesh::Reference(in_RDI);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_RDI);
  CleanElementsConnects((TPZMultiphysicsCompMesh *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
  TPZCompMesh::AutoBuild(&this_00->super_TPZCompMesh,in_stack_ffffffffffffff48);
  AddElements(in_stack_00000110);
  AddConnects(in_stack_00000250);
  LoadSolutionFromMeshes(this_00);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpace(TPZVec<TPZCompMesh * > & mesh_vector, const TPZVec<int64_t> &gelindexes){
    
    m_mesh_vector          = mesh_vector;
    m_active_approx_spaces.Resize(m_mesh_vector.size());
    for(int64_t i = 0; i< m_active_approx_spaces.size(); i++) m_active_approx_spaces[i] = 1;
    int n_approx_spaces = m_mesh_vector.size();
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    // if(ApproxSpace().Style() != TPZCreateApproximationSpace::EMultiphysics)
    // {
    //     std::cout << __PRETTY_FUNCTION__ << " Modifying the style of approximation space "
    //     " to multiphysics\n";
    //     SetAllCreateFunctionsMultiphysicElem();
    // }
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild(gelindexes);
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
}